

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O1

bool has_screen_changes(void)

{
  byte *pbVar1;
  ulong uVar2;
  CDeviceSlot *pCVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  pCVar3 = CDevice::GetSlot(Device,1);
  pbVar1 = pCVar3->Page->RAM;
  lVar4 = 0;
  bVar6 = true;
  do {
    if (pbVar1[lVar4] != '\0') {
      return true;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1800);
  if (pbVar1[0x1800] == '8') {
    uVar2 = 0x1800;
    do {
      uVar5 = uVar2;
      if (uVar5 == 0x1aff) break;
      uVar2 = uVar5 + 1;
    } while (pbVar1[uVar5 + 1] == '8');
    bVar6 = uVar5 < 0x1aff;
  }
  return bVar6;
}

Assistant:

static bool has_screen_changes() {
	unsigned char *pscr = (unsigned char*)Device->GetSlot(1)->Page->RAM;

	for (int i=0; i < 0x1800;i++) {
		if (0 != pscr[i]) {
			return true;
		}
	}

	for (int i=0x1800; i < 0x1B00;i++) {
		if (0x38 != pscr[i]) {
			return true;
		}
	}

	return false;
}